

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

Literal * Kernel::SubstHelper::apply<Kernel::Substitution>(Literal *lit,Substitution *applicator)

{
  bool bVar1;
  Literal *in_RDI;
  TermList unaff_retaddr;
  TermList in_stack_00000008;
  TermList in_stack_00000010;
  TermList newSort;
  TermList sort;
  Literal *subbedLit;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  TermList in_stack_ffffffffffffffb8;
  TermList local_28;
  TermList local_20;
  Term *local_18;
  undefined1 polarity;
  
  local_18 = apply<Kernel::Substitution>
                       ((Term *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        (Substitution *)
                        CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),false);
  bVar1 = Term::isTwoVarEquality(local_18);
  if (bVar1) {
    local_20 = Literal::twoVarEqSort(in_RDI);
    polarity = (undefined1)((ulong)in_RDI >> 0x38);
    local_28 = apply<Kernel::Substitution>
                         (in_stack_ffffffffffffffb8,
                          (Substitution *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          (bool)in_stack_ffffffffffffffaf);
    bVar1 = TermList::operator!=(&local_20,&local_28);
    if (bVar1) {
      Literal::polarity((Literal *)0x729dd5);
      Term::nthArgument(local_18,0);
      Term::nthArgument(local_18,1);
      local_18 = &Literal::createEquality
                            ((bool)polarity,in_stack_00000010,in_stack_00000008,unaff_retaddr)->
                  super_Term;
    }
  }
  return (Literal *)local_18;
}

Assistant:

static Literal* apply(Literal* lit, Applicator& applicator)
  {
    Literal* subbedLit = static_cast<Literal*>(apply(static_cast<Term*>(lit),applicator));
    if(subbedLit->isTwoVarEquality()){ //either nothing's changed or variant
      TermList sort = lit->twoVarEqSort();
      TermList newSort = apply(sort, applicator);
      if((sort != newSort)){
        subbedLit = Literal::createEquality(subbedLit->polarity(), *subbedLit->nthArgument(0), *subbedLit->nthArgument(1), newSort);
      }
    }
    return subbedLit;
  }